

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O2

int BeliefValue::GetMaximizingVectorIndexAndValue
              (BeliefInterface *b,VectorSet *v,vector<bool,_std::allocator<bool>_> *mask,
              double *value)

{
  const_reference cVar1;
  E *pEVar2;
  ulong uVar3;
  ulong uVar4;
  int k;
  size_type __n;
  int k_1;
  ulong __n_00;
  vector<double,_std::allocator<double>_> Vb;
  
  if ((*(int *)&(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_p -
      *(int *)&(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p) * 8 +
      (mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset != (int)v->size1_) {
    pEVar2 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar2,"BeliefValue::GetMaximizingVectorIndex: mask has incorrect size");
    __cxa_throw(pEVar2,&E::typeinfo,E::~E);
  }
  uVar4 = v->size1_ & 0xffffffff;
  __n = 0;
  do {
    if (uVar4 == __n) {
      return -1;
    }
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,__n);
    __n = __n + 1;
  } while (!cVar1);
  (*b->_vptr_BeliefInterface[0x12])(&Vb,b,v,mask);
  uVar3 = 0x7fffffff;
  *value = -1.79769313486232e+308;
  for (__n_00 = 0; uVar4 != __n_00; __n_00 = __n_00 + 1) {
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](mask,__n_00);
    if ((cVar1) &&
       (*value < Vb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[__n_00])) {
      uVar3 = __n_00 & 0xffffffff;
      *value = Vb.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[__n_00];
    }
  }
  if ((*value == -1.79769313486232e+308) && (!NAN(*value))) {
    pEVar2 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar2,"BeliefValue::GetMaximizingVectorIndex: no maximizing vector found");
    __cxa_throw(pEVar2,&E::typeinfo,E::~E);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&Vb.super__Vector_base<double,_std::allocator<double>_>);
  return (int)uVar3;
}

Assistant:

int 
BeliefValue::GetMaximizingVectorIndexAndValue(const BeliefInterface &b, 
                                              const VectorSet &v,
                                              const vector<bool> &mask,
                                              double &value)
{
    //ugly, copy of JointBelief version..

    int nrInV=v.size1();
    int maximizingVectorI=INT_MAX;
    bool maskValid=false;

    if(static_cast<int>(mask.size())!=nrInV)
    {
        throw(E("BeliefValue::GetMaximizingVectorIndex: mask has incorrect size"));
    }

    for(int k=0;k!=nrInV;k++)
        if(mask[k])
        {
            maskValid=true;
            break;
        }

    // no vector was enabled in the mask, so there is no maximizing vector
    if(!maskValid)
        return(-1);

    // compute value of b for every vector in VS which has its mask
    // set to true
    vector<double> Vb=b.InnerProduct(v,mask);

    // find maximizing vector, ignores effects of duplicate values
    value=-DBL_MAX;
    for(int k=0;k!=nrInV;k++)
    {
        if(mask[k] && Vb[k]>value)
        {
            value=Vb[k];
            maximizingVectorI=k;
        }
    }

    if(value==-DBL_MAX)
    {
         throw(E("BeliefValue::GetMaximizingVectorIndex: no maximizing vector found"));
    }
    return(maximizingVectorI);
}